

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O0

void Omega_h::make_1d_box(Real x,LO nx,LOs *ev2v_out,Reals *coords_out)

{
  int size_in;
  Write<double> local_130;
  Read<double> local_120;
  Write<int> local_110;
  Read<int> local_100;
  undefined1 local_f0 [8];
  type fill_conn;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Write<int> ev2v;
  type fill_coords;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  Write<double> coords;
  Real dx;
  LO nv;
  LO ne;
  Reals *coords_out_local;
  LOs *ev2v_out_local;
  LO nx_local;
  Real x_local;
  
  size_in = nx + 1;
  coords.shared_alloc_.direct_ptr = (void *)(x / (double)nx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  Write<double>::Write((Write<double> *)local_48,size_in,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ev2v.shared_alloc_.direct_ptr._0_4_ = size_in;
  Write<double>::Write((Write<double> *)&fill_coords,(Write<double> *)local_48);
  fill_coords.coords.shared_alloc_.direct_ptr = coords.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__0>
            (size_in,(type *)&ev2v.shared_alloc_.direct_ptr,"make_1d_box(coords)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"",(allocator *)((long)&fill_conn.ev2v.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_b0,nx * 2,(string *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&fill_conn.ev2v.shared_alloc_.direct_ptr + 7));
  local_f0._0_4_ = nx;
  Write<int>::Write((Write<int> *)&fill_conn,(Write<int> *)local_b0);
  parallel_for<Omega_h::make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__1>
            (nx,(type *)local_f0,"make_1d_box(conn)");
  Write<int>::Write(&local_110,(Write<int> *)local_b0);
  Read<int>::Read(&local_100,&local_110);
  Read<int>::operator=(ev2v_out,&local_100);
  Read<int>::~Read(&local_100);
  Write<int>::~Write(&local_110);
  Write<double>::Write(&local_130,(Write<double> *)local_48);
  Read<double>::Read(&local_120,&local_130);
  Read<double>::operator=(coords_out,&local_120);
  Read<double>::~Read(&local_120);
  Write<double>::~Write(&local_130);
  make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_1::~__1((__1 *)local_f0);
  Write<int>::~Write((Write<int> *)local_b0);
  make_1d_box(double,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_0::~__0
            ((__0 *)&ev2v.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_48);
  return;
}

Assistant:

void make_1d_box(Real x, LO nx, LOs* ev2v_out, Reals* coords_out) {
  LO ne = nx;
  LO nv = nx + 1;
  Real dx = x / nx;
  Write<Real> coords(nv);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO i = v % nv;
    coords[v] = i * dx;
  };
  parallel_for(nv, fill_coords, "make_1d_box(coords)");
  Write<LO> ev2v(ne * 2);
  auto fill_conn = OMEGA_H_LAMBDA(LO q) {
    LO i = q % ne;
    ev2v[q * 2 + 0] = i + 0;
    ev2v[q * 2 + 1] = i + 1;
  };
  parallel_for(ne, fill_conn, "make_1d_box(conn)");
  *ev2v_out = ev2v;
  *coords_out = coords;
}